

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

bool __thiscall pg::SSPMSolver::lift(SSPMSolver *this,int v,int target,int *str,int pl)

{
  uint uVar1;
  Game *pGVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  bool bVar11;
  _label_vertex local_70;
  bitset *local_60;
  bitset *local_58;
  int local_4c;
  int *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar8 = (ulong)v;
  if (this->pm_d[(long)this->l * uVar8] != -1) {
    uVar1 = ((this->super_Solver).game)->_priority[uVar8];
    iVar10 = ~((int)(uVar1 + (pl == 0)) / 2) + this->h;
    local_48 = str;
    if (1 < (this->super_Solver).trace) {
      poVar6 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[37;1mupdating vertex ",0x17);
      local_70.g = (this->super_Solver).game;
      local_70.v = v;
      poVar6 = operator<<(poVar6,&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," => ",4);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      bVar11 = ((((this->super_Solver).game)->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0;
      pcVar7 = " (odd)";
      if (!bVar11) {
        pcVar7 = " (even)";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,7 - (ulong)bVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m with current measure",0x18);
      stream_pm(this,(this->super_Solver).logger,v);
      poVar6 = (this->super_Solver).logger;
      cVar3 = (char)poVar6;
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    pGVar2 = (this->super_Solver).game;
    local_38 = uVar8 >> 6;
    if ((target == -1) ||
       ((uint)(((pGVar2->_owner)._bits[local_38] >> (uVar8 & 0x3f) & 1) != 0) != pl)) {
      iVar5 = pGVar2->_outedges[pGVar2->_firstouts[uVar8]];
      local_4c = v;
      if (iVar5 != -1) {
        local_40 = 1L << (uVar8 & 0x3f);
        local_58 = &this->tmp_b;
        piVar9 = pGVar2->_outedges + (long)pGVar2->_firstouts[uVar8] + 1;
        local_60 = &this->best_b;
        bVar11 = true;
        do {
          if ((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar5 >> 6] >>
               ((long)iVar5 & 0x3fU) & 1) == 0) {
            to_tmp(this,iVar5);
            if (1 < (this->super_Solver).trace) {
              poVar6 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"to successor ",0xd);
              local_70.g = (this->super_Solver).game;
              local_70.v = iVar5;
              poVar6 = operator<<(poVar6,&local_70);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," from",5);
              stream_tmp(this,(this->super_Solver).logger,this->h);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_Solver).logger," =>",3);
            }
            if ((uVar1 & 1) == pl) {
              prog_tmp(this,iVar10,this->h);
            }
            else {
              trunc_tmp(this,iVar10);
            }
            if (1 < (this->super_Solver).trace) {
              stream_tmp(this,(this->super_Solver).logger,this->h);
              poVar6 = (this->super_Solver).logger;
              cVar3 = (char)poVar6;
              std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
            }
            if (bVar11) {
LAB_001679a7:
              bitset::operator=(local_60,local_58);
              memcpy(this->best_d,this->tmp_d,(ulong)(uint)this->l << 2);
              *local_48 = iVar5;
            }
            else {
              uVar8 = (((this->super_Solver).game)->_owner)._bits[local_38] & local_40;
              iVar4 = compare(this,iVar10);
              if ((uint)(uVar8 != 0) == pl) {
                if (0 < iVar4) goto LAB_001679a7;
              }
              else if (iVar4 < 0) goto LAB_001679a7;
            }
            bVar11 = false;
          }
          iVar5 = *piVar9;
          piVar9 = piVar9 + 1;
        } while (iVar5 != -1);
      }
      iVar5 = local_4c;
      to_tmp(this,local_4c);
      iVar10 = compare(this,iVar10);
      if (-1 < iVar10) {
        return SUB41((uint)iVar10 >> 0x1f,0);
      }
      if (0 < (this->super_Solver).trace) {
        poVar6 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m",0x20);
        local_70.g = (this->super_Solver).game;
        local_70.v = iVar5;
        poVar6 = operator<<(poVar6,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m:",4);
        stream_best(this,(this->super_Solver).logger,this->h);
        poVar6 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," (to ",5);
        local_70.v = *local_48;
        local_70.g = (this->super_Solver).game;
        poVar6 = operator<<(poVar6,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      }
      from_best(this,iVar5);
      return true;
    }
    to_tmp(this,target);
    if ((uVar1 & 1) == pl) {
      prog_tmp(this,iVar10,this->h);
    }
    else {
      trunc_tmp(this,iVar10);
    }
    to_best(this,v);
    iVar5 = compare(this,iVar10);
    if (0 < iVar5) {
      from_tmp(this,v);
      if (1 < (this->super_Solver).trace) {
        poVar6 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"to successor ",0xd);
        local_70.g = (this->super_Solver).game;
        local_70.v = target;
        poVar6 = operator<<(poVar6,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        stream_tmp(this,(this->super_Solver).logger,this->h);
        std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," =>",3);
      }
      if ((uVar1 & 1) == pl) {
        prog_tmp(this,iVar10,this->h);
      }
      else {
        trunc_tmp(this,iVar10);
      }
      if (1 < (this->super_Solver).trace) {
        stream_tmp(this,(this->super_Solver).logger,this->h);
        poVar6 = (this->super_Solver).logger;
        cVar3 = (char)poVar6;
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
      }
      if ((this->super_Solver).trace < 1) {
        return true;
      }
      poVar6 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\x1b[32;1mnew measure\x1b[m of \x1b[36;1m",0x20);
      local_70.g = (this->super_Solver).game;
      local_70.v = v;
      poVar6 = operator<<(poVar6,&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m:",4);
      stream_tmp(this,(this->super_Solver).logger,this->h);
      poVar6 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (to ",5);
      local_70.g = (this->super_Solver).game;
      local_70.v = target;
      poVar6 = operator<<(poVar6,&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      return true;
    }
  }
  return false;
}

Assistant:

bool
SSPMSolver::lift(int v, int target, int &str, int pl)
{
    // check if already Top
    if (pm_d[l*v] == -1) return false; // already Top

    const int pr = priority(v);
    const int pindex = pl == 0 ? h-(pr+1)/2-1 : h-pr/2-1;

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[37;1mupdating vertex " << label_vertex(v) << " (" << pr << " => " << pindex << ")" << (owner(v)?" (odd)":" (even)") << "\033[m with current measure";
        stream_pm(logger, v);
        logger << std::endl;
    }
#endif

    // if even owns and target is set, just check if specific target is better
    if (owner(v) == pl and target != -1) {
        to_tmp(target);
        if (pl == (pr&1)) prog_tmp(pindex, h);
        else trunc_tmp(pindex);
        to_best(v);
        if (compare(pindex) > 0) {
            from_tmp(v);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "to successor " << label_vertex(target) << ":";
                stream_tmp(logger, h);
                logger << " =>";
            }
#endif
            if (pl == (pr&1)) prog_tmp(pindex, h);
            else trunc_tmp(pindex);
#ifndef NDEBUG
            if (trace >= 2) {
                stream_tmp(logger, h);
                logger << std::endl;
            }
#endif
#ifndef NDEBUG
            if (trace >= 1) {
                logger << "\033[32;1mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
                stream_tmp(logger, h);
                logger << " (to " << label_vertex(target) << ")\n";
            }
#endif
            return true;
        } else {
            return false;
        }
    }

    // compute best measure
    bool first = true;
    for (auto curedge = outs(v); *curedge != -1; curedge++) {
        int to = *curedge;
        if (disabled[to]) continue;
        to_tmp(to);
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(to) << " from";
            stream_tmp(logger, h);
            logger << " =>";
        }
#endif
        if (pl == (pr&1)) prog_tmp(pindex, h);
        else trunc_tmp(pindex);
#ifndef NDEBUG
        if (trace >= 2) {
            stream_tmp(logger, h);
            logger << std::endl;
        }
#endif
        if (first) {
            tmp_to_best();
            str = to;
        } else if (owner(v) == pl) {
            // we want the max!
            if (compare(pindex) > 0) {
                tmp_to_best();
                str = to;
            }
        } else {
            // we want the min!
            if (compare(pindex) < 0) {
                tmp_to_best();
                str = to;
            }
        }
        first = false;
    }

    // set best to pm if higher
    to_tmp(v);
    if (compare(pindex) < 0) {
#ifndef NDEBUG
        if (trace >= 1) {
            logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
            stream_best(logger, h);
            logger << " (to " << label_vertex(str) << ")\n";
        }
#endif
        from_best(v);
        return true;
    } else {
        return false;
    }
}